

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_compressStream2
                 (ZSTD_CCtx *cctx,ZSTD_outBuffer *output,ZSTD_inBuffer *input,
                 ZSTD_EndDirective endOp)

{
  ZSTD_cStreamStage ZVar1;
  void *pvVar2;
  void *pvVar3;
  size_t sVar4;
  ZSTD_bufferMode_e ZVar5;
  void *pvVar6;
  ulong uVar7;
  char *dst;
  ulong uVar8;
  char *dst_00;
  bool bVar9;
  size_t err_code;
  void *pvVar10;
  ulong uVar11;
  void *pvVar12;
  size_t sVar13;
  long local_60;
  
  if (output->size < output->pos) {
    return 0xffffffffffffffba;
  }
  uVar11 = input->size;
  uVar8 = input->pos;
  if (uVar11 < uVar8) {
    return 0xffffffffffffffb8;
  }
  if (ZSTD_e_end < endOp) {
    return 0xffffffffffffffd6;
  }
  if (cctx->streamStage == zcss_init) {
    sVar13 = (uVar11 - uVar8) + cctx->stableIn_notConsumed;
    if (((endOp == ZSTD_e_continue) && ((cctx->requestedParams).inBufferMode == ZSTD_bm_stable)) &&
       (sVar13 < 0x20000)) {
      if (cctx->stableIn_notConsumed != 0) {
        if (input->src != (cctx->expectedInBuffer).src) {
          return 0xffffffffffffffce;
        }
        if (uVar8 != (cctx->expectedInBuffer).size) {
          return 0xffffffffffffffce;
        }
      }
      input->pos = uVar11;
      (cctx->expectedInBuffer).pos = uVar11;
      sVar4 = input->size;
      (cctx->expectedInBuffer).src = input->src;
      (cctx->expectedInBuffer).size = sVar4;
      cctx->stableIn_notConsumed = sVar13;
      return (ulong)((cctx->requestedParams).format == ZSTD_f_zstd1) * 4 + 2;
    }
    sVar13 = ZSTD_CCtx_init_compressStream2(cctx,endOp,sVar13);
    if (0xffffffffffffff88 < sVar13) {
      return sVar13;
    }
    ZVar5 = (cctx->appliedParams).inBufferMode;
    if (ZVar5 == ZSTD_bm_stable) {
      (cctx->expectedInBuffer).pos = input->pos;
      sVar13 = input->size;
      (cctx->expectedInBuffer).src = input->src;
      (cctx->expectedInBuffer).size = sVar13;
    }
    if ((cctx->appliedParams).outBufferMode == ZSTD_bm_stable) {
      cctx->expectedOutBufferSize = output->size - output->pos;
    }
  }
  else {
    ZVar5 = (cctx->appliedParams).inBufferMode;
  }
  if (ZVar5 == ZSTD_bm_stable) {
    if ((cctx->expectedInBuffer).src != input->src) {
      return 0xffffffffffffffce;
    }
    if ((cctx->expectedInBuffer).pos != input->pos) {
      return 0xffffffffffffffce;
    }
  }
  if (((cctx->appliedParams).outBufferMode == ZSTD_bm_stable) &&
     (cctx->expectedOutBufferSize != output->size - output->pos)) {
    return 0xffffffffffffffce;
  }
  pvVar2 = input->src;
  if (pvVar2 == (void *)0x0) {
    pvVar10 = (void *)0x0;
    pvVar6 = (void *)0x0;
  }
  else {
    pvVar10 = (void *)(input->size + (long)pvVar2);
    pvVar6 = (void *)(input->pos + (long)pvVar2);
  }
  pvVar3 = output->dst;
  if (pvVar3 == (void *)0x0) {
    local_60 = 0;
    dst_00 = (char *)0x0;
  }
  else {
    local_60 = output->size + (long)pvVar3;
    dst_00 = (char *)(output->pos + (long)pvVar3);
  }
  if (ZVar5 == ZSTD_bm_stable) {
    sVar13 = cctx->stableIn_notConsumed;
    input->pos = input->pos - sVar13;
    if (pvVar6 != (void *)0x0) {
      pvVar6 = (void *)((long)pvVar6 - sVar13);
    }
    cctx->stableIn_notConsumed = 0;
  }
LAB_01d24dfa:
  do {
    ZVar1 = cctx->streamStage;
    do {
      if (ZVar1 == zcss_init) {
        return 0xffffffffffffffc2;
      }
      if (ZVar1 == zcss_load) {
        pvVar12 = pvVar10;
        if (endOp == ZSTD_e_end) {
          sVar13 = (long)pvVar10 - (long)pvVar6;
          if (sVar13 < 0xff00ff00ff00ff00) {
            uVar11 = (ulong)(0x20000U - (int)sVar13 >> 0xb);
            if (0x1ffff < sVar13) {
              uVar11 = 0;
            }
            uVar11 = uVar11 + (sVar13 >> 8) + sVar13;
            if (uVar11 == 0) goto LAB_01d24e69;
          }
          else {
LAB_01d24e69:
            uVar11 = 0xffffffffffffffb8;
          }
          if (((uVar11 <= (ulong)(local_60 - (long)dst_00)) ||
              ((cctx->appliedParams).outBufferMode == ZSTD_bm_stable)) && (cctx->inBuffPos == 0)) {
            sVar13 = ZSTD_compressEnd_public(cctx,dst_00,local_60 - (long)dst_00,pvVar6,sVar13);
            if (0xffffffffffffff88 < sVar13) {
              return sVar13;
            }
            dst_00 = dst_00 + sVar13;
            cctx->streamStage = zcss_init;
            cctx->frameEnded = 1;
            cctx->pledgedSrcSizePlusOne = 0;
            goto LAB_01d2522c;
          }
        }
        if ((cctx->appliedParams).inBufferMode == ZSTD_bm_buffered) {
          sVar13 = cctx->inBuffPos;
          uVar8 = cctx->inBuffTarget - sVar13;
          uVar11 = (long)pvVar10 - (long)pvVar6;
          if (uVar8 < (ulong)((long)pvVar10 - (long)pvVar6)) {
            uVar11 = uVar8;
          }
          if (uVar11 != 0) {
            switchD_015de399::default(cctx->inBuff + sVar13,pvVar6,uVar11);
            sVar13 = cctx->inBuffPos;
          }
          uVar8 = sVar13 + uVar11;
          cctx->inBuffPos = uVar8;
          pvVar12 = (void *)(uVar11 + (long)pvVar6);
          if (pvVar6 == (void *)0x0) {
            pvVar12 = pvVar6;
          }
          pvVar6 = pvVar12;
          if (endOp == ZSTD_e_flush) {
            if (uVar8 == cctx->inToCompress) goto LAB_01d2522c;
          }
          else if ((endOp == ZSTD_e_continue) && (uVar8 < cctx->inBuffTarget)) goto LAB_01d2522c;
LAB_01d24f67:
          sVar13 = local_60 - (long)dst_00;
          if ((cctx->appliedParams).inBufferMode != ZSTD_bm_buffered) goto LAB_01d24f80;
          uVar11 = cctx->inBuffPos - cctx->inToCompress;
          bVar9 = true;
        }
        else {
          if (endOp == ZSTD_e_flush) {
            if (pvVar6 == pvVar10) goto LAB_01d2522c;
          }
          else if (endOp == ZSTD_e_continue) {
            if (cctx->blockSize <= (ulong)((long)pvVar10 - (long)pvVar6)) goto LAB_01d24f67;
            cctx->stableIn_notConsumed = (long)pvVar10 - (long)pvVar6;
            goto LAB_01d2522c;
          }
          sVar13 = local_60 - (long)dst_00;
LAB_01d24f80:
          uVar11 = (long)pvVar10 - (long)pvVar6;
          if (cctx->blockSize <= (ulong)((long)pvVar10 - (long)pvVar6)) {
            uVar11 = cctx->blockSize;
          }
          bVar9 = false;
        }
        if (uVar11 < 0xff00ff00ff00ff00) {
          uVar8 = (ulong)(0x20000U - (int)uVar11 >> 0xb);
          if (0x1ffff < uVar11) {
            uVar8 = 0;
          }
          uVar8 = uVar8 + (uVar11 >> 8) + uVar11;
          if (uVar8 == 0) goto LAB_01d24fea;
        }
        else {
LAB_01d24fea:
          uVar8 = 0xffffffffffffffb8;
        }
        dst = dst_00;
        if ((sVar13 < uVar8) && ((cctx->appliedParams).outBufferMode != ZSTD_bm_stable)) {
          sVar13 = cctx->outBuffSize;
          dst = cctx->outBuff;
        }
        if (bVar9) {
          bVar9 = pvVar6 == pvVar10 && endOp == ZSTD_e_end;
          if (pvVar6 == pvVar10 && endOp == ZSTD_e_end) {
            uVar11 = ZSTD_compressEnd_public
                               (cctx,dst,sVar13,cctx->inBuff + cctx->inToCompress,uVar11);
          }
          else {
            uVar11 = ZSTD_compressContinue_internal
                               (cctx,dst,sVar13,cctx->inBuff + cctx->inToCompress,uVar11,1,0);
          }
          if (0xffffffffffffff88 < uVar11) {
            return uVar11;
          }
          cctx->frameEnded = (uint)bVar9;
          sVar13 = cctx->inBuffPos;
          uVar8 = cctx->blockSize + sVar13;
          cctx->inBuffTarget = uVar8;
          if (cctx->inBuffSize < uVar8) {
            cctx->inBuffPos = 0;
            cctx->inBuffTarget = cctx->blockSize;
            sVar13 = 0;
          }
          cctx->inToCompress = sVar13;
        }
        else {
          pvVar12 = (void *)((long)pvVar6 + uVar11);
          bVar9 = pvVar12 == pvVar10 && endOp == ZSTD_e_end;
          if (pvVar12 == pvVar10 && endOp == ZSTD_e_end) {
            uVar11 = ZSTD_compressEnd_public(cctx,dst,sVar13,pvVar6,uVar11);
          }
          else {
            uVar11 = ZSTD_compressContinue_internal(cctx,dst,sVar13,pvVar6,uVar11,1,0);
          }
          if (0xffffffffffffff88 < uVar11) {
            return uVar11;
          }
          if (pvVar6 != (void *)0x0) {
            pvVar6 = pvVar12;
          }
          cctx->frameEnded = (uint)bVar9;
        }
        if (dst != dst_00) {
          cctx->outBuffContentSize = uVar11;
          cctx->outBuffFlushedSize = 0;
          cctx->streamStage = zcss_flush;
          sVar13 = 0;
          goto LAB_01d25175;
        }
        dst_00 = dst_00 + uVar11;
        if (bVar9) goto LAB_01d25214;
        goto LAB_01d24dfa;
      }
    } while (ZVar1 != zcss_flush);
    uVar11 = cctx->outBuffContentSize;
    sVar13 = cctx->outBuffFlushedSize;
LAB_01d25175:
    uVar11 = uVar11 - sVar13;
    uVar7 = local_60 - (long)dst_00;
    uVar8 = uVar11;
    if (uVar7 < uVar11) {
      uVar8 = uVar7;
    }
    if (uVar8 != 0) {
      switchD_015de399::default(dst_00,cctx->outBuff + sVar13,uVar8);
      sVar13 = cctx->outBuffFlushedSize;
    }
    dst_00 = dst_00 + uVar8;
    cctx->outBuffFlushedSize = sVar13 + uVar8;
    pvVar12 = pvVar6;
    if (uVar7 < uVar11) goto LAB_01d2522c;
    cctx->outBuffContentSize = 0;
    cctx->outBuffFlushedSize = 0;
    if (cctx->frameEnded != 0) {
LAB_01d25214:
      cctx->streamStage = zcss_init;
      cctx->pledgedSrcSizePlusOne = 0;
      pvVar12 = pvVar6;
LAB_01d2522c:
      input->pos = (long)pvVar12 - (long)pvVar2;
      output->pos = (long)dst_00 - (long)pvVar3;
      ZVar5 = (cctx->appliedParams).inBufferMode;
      if (cctx->frameEnded == 0) {
        if (ZVar5 == ZSTD_bm_stable) {
          sVar13 = cctx->blockSize - cctx->stableIn_notConsumed;
        }
        else {
          sVar13 = cctx->inBuffTarget - cctx->inBuffPos;
          if (sVar13 == 0) {
            sVar13 = cctx->blockSize;
          }
        }
        if (0xffffffffffffff88 < sVar13) {
          return sVar13;
        }
      }
      if (ZVar5 == ZSTD_bm_stable) {
        (cctx->expectedInBuffer).pos = input->pos;
        sVar13 = input->size;
        (cctx->expectedInBuffer).src = input->src;
        (cctx->expectedInBuffer).size = sVar13;
      }
      if ((cctx->appliedParams).outBufferMode == ZSTD_bm_stable) {
        cctx->expectedOutBufferSize = output->size - output->pos;
      }
      return cctx->outBuffContentSize - cctx->outBuffFlushedSize;
    }
    cctx->streamStage = zcss_load;
  } while( true );
}

Assistant:

size_t ZSTD_compressStream2( ZSTD_CCtx* cctx,
                             ZSTD_outBuffer* output,
                             ZSTD_inBuffer* input,
                             ZSTD_EndDirective endOp)
{
    DEBUGLOG(5, "ZSTD_compressStream2, endOp=%u ", (unsigned)endOp);
    /* check conditions */
    RETURN_ERROR_IF(output->pos > output->size, dstSize_tooSmall, "invalid output buffer");
    RETURN_ERROR_IF(input->pos  > input->size, srcSize_wrong, "invalid input buffer");
    RETURN_ERROR_IF((U32)endOp > (U32)ZSTD_e_end, parameter_outOfBound, "invalid endDirective");
    assert(cctx != NULL);

    /* transparent initialization stage */
    if (cctx->streamStage == zcss_init) {
        size_t const inputSize = input->size - input->pos;  /* no obligation to start from pos==0 */
        size_t const totalInputSize = inputSize + cctx->stableIn_notConsumed;
        if ( (cctx->requestedParams.inBufferMode == ZSTD_bm_stable) /* input is presumed stable, across invocations */
          && (endOp == ZSTD_e_continue)                             /* no flush requested, more input to come */
          && (totalInputSize < ZSTD_BLOCKSIZE_MAX) ) {              /* not even reached one block yet */
            if (cctx->stableIn_notConsumed) {  /* not the first time */
                /* check stable source guarantees */
                RETURN_ERROR_IF(input->src != cctx->expectedInBuffer.src, stabilityCondition_notRespected, "stableInBuffer condition not respected: wrong src pointer");
                RETURN_ERROR_IF(input->pos != cctx->expectedInBuffer.size, stabilityCondition_notRespected, "stableInBuffer condition not respected: externally modified pos");
            }
            /* pretend input was consumed, to give a sense forward progress */
            input->pos = input->size;
            /* save stable inBuffer, for later control, and flush/end */
            cctx->expectedInBuffer = *input;
            /* but actually input wasn't consumed, so keep track of position from where compression shall resume */
            cctx->stableIn_notConsumed += inputSize;
            /* don't initialize yet, wait for the first block of flush() order, for better parameters adaptation */
            return ZSTD_FRAMEHEADERSIZE_MIN(cctx->requestedParams.format);  /* at least some header to produce */
        }
        FORWARD_IF_ERROR(ZSTD_CCtx_init_compressStream2(cctx, endOp, totalInputSize), "compressStream2 initialization failed");
        ZSTD_setBufferExpectations(cctx, output, input);   /* Set initial buffer expectations now that we've initialized */
    }
    /* end of transparent initialization stage */

    FORWARD_IF_ERROR(ZSTD_checkBufferStability(cctx, output, input, endOp), "invalid buffers");
    /* compression stage */
#ifdef ZSTD_MULTITHREAD
    if (cctx->appliedParams.nbWorkers > 0) {
        size_t flushMin;
        if (cctx->cParamsChanged) {
            ZSTDMT_updateCParams_whileCompressing(cctx->mtctx, &cctx->requestedParams);
            cctx->cParamsChanged = 0;
        }
        if (cctx->stableIn_notConsumed) {
            assert(cctx->appliedParams.inBufferMode == ZSTD_bm_stable);
            /* some early data was skipped - make it available for consumption */
            assert(input->pos >= cctx->stableIn_notConsumed);
            input->pos -= cctx->stableIn_notConsumed;
            cctx->stableIn_notConsumed = 0;
        }
        for (;;) {
            size_t const ipos = input->pos;
            size_t const opos = output->pos;
            flushMin = ZSTDMT_compressStream_generic(cctx->mtctx, output, input, endOp);
            cctx->consumedSrcSize += (U64)(input->pos - ipos);
            cctx->producedCSize += (U64)(output->pos - opos);
            if ( ZSTD_isError(flushMin)
              || (endOp == ZSTD_e_end && flushMin == 0) ) { /* compression completed */
                if (flushMin == 0)
                    ZSTD_CCtx_trace(cctx, 0);
                ZSTD_CCtx_reset(cctx, ZSTD_reset_session_only);
            }
            FORWARD_IF_ERROR(flushMin, "ZSTDMT_compressStream_generic failed");

            if (endOp == ZSTD_e_continue) {
                /* We only require some progress with ZSTD_e_continue, not maximal progress.
                 * We're done if we've consumed or produced any bytes, or either buffer is
                 * full.
                 */
                if (input->pos != ipos || output->pos != opos || input->pos == input->size || output->pos == output->size)
                    break;
            } else {
                assert(endOp == ZSTD_e_flush || endOp == ZSTD_e_end);
                /* We require maximal progress. We're done when the flush is complete or the
                 * output buffer is full.
                 */
                if (flushMin == 0 || output->pos == output->size)
                    break;
            }
        }
        DEBUGLOG(5, "completed ZSTD_compressStream2 delegating to ZSTDMT_compressStream_generic");
        /* Either we don't require maximum forward progress, we've finished the
         * flush, or we are out of output space.
         */
        assert(endOp == ZSTD_e_continue || flushMin == 0 || output->pos == output->size);
        ZSTD_setBufferExpectations(cctx, output, input);
        return flushMin;
    }
#endif /* ZSTD_MULTITHREAD */
    FORWARD_IF_ERROR( ZSTD_compressStream_generic(cctx, output, input, endOp) , "");
    DEBUGLOG(5, "completed ZSTD_compressStream2");
    ZSTD_setBufferExpectations(cctx, output, input);
    return cctx->outBuffContentSize - cctx->outBuffFlushedSize; /* remaining to flush */
}